

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

Path * kj::anon_unknown_8::DiskFilesystem::computeCurrentPath(void)

{
  bool bVar1;
  NullableValue<kj::Exception> *other;
  Exception *pEVar2;
  Path *pPVar3;
  char *pcVar4;
  int *piVar5;
  Type *func;
  Path *in_RDI;
  ArrayPtr<char> AVar6;
  StringPtr path_00;
  Fault local_5e0;
  Fault f_2;
  Fault local_5c8;
  Fault f_1;
  undefined1 local_5b0 [8];
  StringPtr path;
  Fault f;
  undefined1 auStack_590 [4];
  int error;
  ArrayPtr<char> buf;
  Array<char> buf_heap;
  char buf_stack [256];
  bool buf_isOnStack;
  size_t buf_size;
  size_t size;
  bool _kj_shouldLog_1;
  bool _kj_shouldLog;
  ArrayDisposer **local_430;
  __syscall_slong_t *local_428;
  __syscall_slong_t *local_420;
  undefined1 *local_418;
  Maybe<kj::Exception> local_410;
  undefined1 local_2b0 [8];
  NullableValue<kj::Exception> e;
  stat dotStat;
  stat pwdStat;
  Path result;
  char *pwd;
  
  result.parts.disposer = (ArrayDisposer *)getenv("PWD");
  if (result.parts.disposer == (ArrayDisposer *)0x0) goto LAB_00613ea5;
  Path::Path((Path *)(pwdStat.__glibc_reserved + 2),(void *)0x0);
  local_430 = &result.parts.disposer;
  local_420 = dotStat.__glibc_reserved + 2;
  local_418 = (undefined1 *)((long)&e.field_1 + 0x150);
  local_428 = pwdStat.__glibc_reserved + 2;
  runCatchingExceptions<kj::(anonymous_namespace)::DiskFilesystem::computeCurrentPath()::_lambda()_1_>
            (&local_410,(kj *)&local_430,func);
  other = _::readMaybe<kj::Exception>(&local_410);
  _::NullableValue<kj::Exception>::NullableValue((NullableValue<kj::Exception> *)local_2b0,other);
  Maybe<kj::Exception>::~Maybe(&local_410);
  pEVar2 = _::NullableValue::operator_cast_to_Exception_((NullableValue *)local_2b0);
  if (pEVar2 == (Exception *)0x0) {
    if ((pwdStat.st_dev != dotStat.st_dev) || (dotStat.__glibc_reserved[2] != e.field_1._336_8_)) {
      size._3_1_ = _::Debug::shouldLog(WARNING);
      while (size._3_1_ != false) {
        _::Debug::log<char_const(&)[57],char_const*&>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x692,WARNING,
                   "\"PWD environment variable doesn\'t match current directory\", pwd",
                   (char (*) [57])"PWD environment variable doesn\'t match current directory",
                   (char **)&result.parts.disposer);
        size._3_1_ = false;
      }
      goto LAB_00613e4f;
    }
    pPVar3 = mv<kj::Path>((Path *)(pwdStat.__glibc_reserved + 2));
    Path::Path(in_RDI,pPVar3);
    bVar1 = true;
  }
  else {
    _kj_shouldLog_1 = _::Debug::shouldLog(WARNING);
    while (_kj_shouldLog_1 != false) {
      pEVar2 = _::NullableValue<kj::Exception>::operator*((NullableValue<kj::Exception> *)local_2b0)
      ;
      _::Debug::log<char_const(&)[39],char_const*&,kj::Exception&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x68c,WARNING,"\"PWD environment variable seems invalid\", pwd, *e",
                 (char (*) [39])"PWD environment variable seems invalid",
                 (char **)&result.parts.disposer,pEVar2);
      _kj_shouldLog_1 = false;
    }
LAB_00613e4f:
    bVar1 = false;
  }
  _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_2b0);
  if (!bVar1) {
    bVar1 = false;
  }
  Path::~Path((Path *)(pwdStat.__glibc_reserved + 2));
  if (bVar1) {
    return in_RDI;
  }
LAB_00613ea5:
  buf_size = 0x100;
  do {
    if (buf_size < 0x101) {
      Array<char>::Array((Array<char> *)&buf.size_,(void *)0x0);
      AVar6 = arrayPtr<char>((char *)&buf_heap.disposer,buf_size);
    }
    else {
      heapArray<char>((Array<char> *)&buf.size_,buf_size);
      AVar6 = kj::Array::operator_cast_to_ArrayPtr((Array *)&buf.size_);
    }
    buf.ptr = (char *)AVar6.size_;
    _auStack_590 = AVar6.ptr;
    pcVar4 = ArrayPtr<char>::begin((ArrayPtr<char> *)auStack_590);
    pcVar4 = getcwd(pcVar4,buf_size);
    if (pcVar4 == (char *)0x0) {
      piVar5 = __errno_location();
      if (*piVar5 != 0x24) {
        _::Debug::Fault::Fault
                  ((Fault *)&path.content.size_,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x6a0,*piVar5,"getcwd()","");
        _::Debug::Fault::fatal((Fault *)&path.content.size_);
      }
      buf_size = buf_size << 1;
      size._4_4_ = 8;
    }
    else {
      pcVar4 = ArrayPtr<char>::begin((ArrayPtr<char> *)auStack_590);
      StringPtr::StringPtr((StringPtr *)local_5b0,pcVar4);
      StringPtr::StringPtr((StringPtr *)&f_1,"(unreachable)");
      bVar1 = StringPtr::startsWith((StringPtr *)local_5b0,(StringPtr *)&f_1);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[45],kj::StringPtr&>
                  (&local_5c8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x6a9,FAILED,"!path.startsWith(\"(unreachable)\")",
                   "\"working directory is not reachable from root\", path",
                   (char (*) [45])"working directory is not reachable from root",
                   (StringPtr *)local_5b0);
        _::Debug::Fault::fatal(&local_5c8);
      }
      StringPtr::StringPtr((StringPtr *)&f_2,"/");
      bVar1 = StringPtr::startsWith((StringPtr *)local_5b0,(StringPtr *)&f_2);
      if (!bVar1) {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[34],kj::StringPtr&>
                  (&local_5e0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x6aa,FAILED,"path.startsWith(\"/\")",
                   "\"current directory is not absolute\", path",
                   (char (*) [34])"current directory is not absolute",(StringPtr *)local_5b0);
        _::Debug::Fault::fatal(&local_5e0);
      }
      path_00 = StringPtr::slice((StringPtr *)local_5b0,1);
      Path::parse(in_RDI,path_00);
      size._4_4_ = 1;
    }
    Array<char>::~Array((Array<char> *)&buf.size_);
    if (size._4_4_ == 1) {
      return in_RDI;
    }
  } while( true );
}

Assistant:

static Path computeCurrentPath() {
    // If env var PWD is set and points to the current directory, use it. This captures the current
    // path according to the user's shell, which may differ from the kernel's idea in the presence
    // of symlinks.
    const char* pwd = getenv("PWD");
    if (pwd != nullptr) {
      Path result = nullptr;
      struct stat pwdStat, dotStat;
      KJ_IF_MAYBE(e, kj::runCatchingExceptions([&]() {
        KJ_ASSERT(pwd[0] == '/') { return; }
        result = Path::parse(pwd + 1);
        KJ_SYSCALL(lstat(result.toString(true).cStr(), &pwdStat), result) { return; }
        KJ_SYSCALL(lstat(".", &dotStat)) { return; }
      })) {
        // failed, give up on PWD
        KJ_LOG(WARNING, "PWD environment variable seems invalid", pwd, *e);
      } else {
        if (pwdStat.st_ino == dotStat.st_ino &&
            pwdStat.st_dev == dotStat.st_dev) {
          return kj::mv(result);
        } else {
          KJ_LOG(WARNING, "PWD environment variable doesn't match current directory", pwd);
        }
      }